

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O2

void __thiscall rst::Parser::ParseBlock(Parser *this,BlockType type,BlockType *prev_type,int indent)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  int iVar4;
  size_t size;
  long lVar5;
  size_type sVar6;
  long lVar7;
  char cVar8;
  char *s;
  byte *pbVar9;
  string text;
  
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  pbVar3 = (byte *)this->ptr_;
  bVar2 = true;
  do {
    pbVar9 = pbVar3;
    if (!bVar2) {
      SkipSpace(this);
      pbVar9 = (byte *)this->ptr_;
      if (((long)pbVar9 - (long)pbVar3 != (long)indent) || (*pbVar9 == 0)) goto LAB_002aca77;
      if (*pbVar9 == 10) break;
    }
    lVar5 = 0;
    lVar7 = 1;
    pbVar3 = pbVar9;
    while ((*pbVar3 != 10 && (*pbVar3 != 0))) {
      pbVar3 = pbVar3 + 1;
      this->ptr_ = (char *)pbVar3;
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 1;
    }
    while (((lVar7 != 1 && ((ulong)pbVar3[-1] < 0x21)) &&
           ((0x100001a00U >> ((ulong)pbVar3[-1] & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + -1;
      lVar7 = lVar7 + -1;
      lVar5 = lVar5 + -1;
    }
    std::__cxx11::string::reserve((ulong)&text);
    cVar8 = (char)&text;
    if (!bVar2) {
      std::__cxx11::string::push_back(cVar8);
    }
    for (; lVar5 != 0; lVar5 = lVar5 + -1) {
      bVar1 = *pbVar9;
      if (((bVar1 - 0xb < 2) || (bVar1 == 0x20)) || (bVar1 != 9)) {
        std::__cxx11::string::push_back(cVar8);
      }
      else {
        std::__cxx11::string::append((char *)&text,0x2bdc80);
      }
      pbVar9 = pbVar9 + 1;
    }
    pbVar3 = (byte *)this->ptr_;
    bVar2 = false;
    if (*pbVar3 == 10) {
      pbVar3 = pbVar3 + 1;
      this->ptr_ = (char *)pbVar3;
      bVar2 = false;
    }
  } while( true );
  this->ptr_ = (char *)(pbVar9 + 1);
LAB_002aca77:
  if (text._M_dataplus._M_p[text._M_string_length - 1] == '\n') {
    std::__cxx11::string::resize((ulong)&text);
  }
  if ((((text._M_string_length < 2 || type != PARAGRAPH) ||
       (text._M_dataplus._M_p[text._M_string_length - 2] != ':')) ||
      (text._M_dataplus._M_p[text._M_string_length - 1] != ':')) ||
     (text._M_dataplus._M_p[text._M_string_length] != '\0')) {
    bVar2 = false;
    sVar6 = text._M_string_length;
LAB_002acae0:
    EnterBlock(this,prev_type,type);
    (*this->handler_->_vptr_ContentHandler[2])(this->handler_,(ulong)type);
    (*this->handler_->_vptr_ContentHandler[4])(this->handler_,text._M_dataplus._M_p,sVar6);
    (*this->handler_->_vptr_ContentHandler[3])();
    if (!bVar2) goto LAB_002acb3f;
  }
  else if (text._M_string_length != 2) {
    sVar6 = text._M_string_length - 1;
    bVar2 = true;
    goto LAB_002acae0;
  }
  iVar4 = *(int *)&this->ptr_;
  SkipSpace(this);
  iVar4 = *(int *)&this->ptr_ - iVar4;
  if (indent < iVar4) {
    ParseBlock(this,LITERAL_BLOCK,prev_type,iVar4);
  }
LAB_002acb3f:
  std::__cxx11::string::~string((string *)&text);
  return;
}

Assistant:

void rst::Parser::ParseBlock(
    rst::BlockType type, rst::BlockType &prev_type, int indent) {
  std::string text;
  for (bool first = true; ; first = false) {
    const char *line_start = ptr_;
    if (!first) {
      // Check indentation.
      SkipSpace();
      if (ptr_ - line_start != indent)
        break;
      if (*ptr_ == '\n') {
        ++ptr_;
        break;  // Empty line ends the block.
      }
      if (!*ptr_)
        break;  // End of input.
    }
    // Strip indentation.
    line_start = ptr_;

    // Find the end of the line.
    while (*ptr_ && *ptr_ != '\n')
      ++ptr_;

    // Strip whitespace at the end of the line.
    const char *end = ptr_;
    while (end != line_start && IsSpace(end[-1]))
      --end;

    // Copy text converting all whitespace characters to spaces.
    text.reserve(end - line_start + 1);
    if (!first)
      text.push_back('\n');
    enum {TAB_WIDTH = 8};
    for (const char *s = line_start; s != end; ++s) {
      char c = *s;
      if (c == '\t') {
        text.append("        ",
            TAB_WIDTH - ((indent + s - line_start) % TAB_WIDTH));
      } else if (IsSpace(c)) {
        text.push_back(' ');
      } else {
        text.push_back(*s);
      }
    }
    if (*ptr_ == '\n')
      ++ptr_;
  }

  // Remove a trailing newline.
  if (*text.rbegin() == '\n')
    text.resize(text.size() - 1);

  bool literal = type == PARAGRAPH && EndsWith(text, "::");
  if (!literal || text.size() != 2) {
    std::size_t size = text.size();
    if (literal)
      --size;
    EnterBlock(prev_type, type);
    handler_->StartBlock(type);
    handler_->HandleText(text.c_str(), size);
    handler_->EndBlock();
  }
  if (literal) {
    // Parse a literal block.
    const char *line_start = ptr_;
    SkipSpace();
    int new_indent = static_cast<int>(ptr_ - line_start);
    if (new_indent > indent)
      ParseBlock(LITERAL_BLOCK, prev_type, new_indent);
  }
}